

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64rapass.cpp
# Opt level: O1

Error __thiscall
asmjit::v1_14::a64::ARMRAPass::_rewrite(ARMRAPass *this,BaseNode *first,BaseNode *stop)

{
  Operand_ *o0;
  BaseNode BVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  BaseNode *pBVar5;
  ulong *puVar6;
  BaseBuilder *pBVar7;
  long lVar8;
  byte *pbVar9;
  bool bVar10;
  uint32_t uVar11;
  Error EVar12;
  undefined8 extraout_RAX;
  ulong uVar13;
  InstId instId;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  bool bVar18;
  GpX dst;
  GpX base;
  Error local_7c;
  Operand_ local_78;
  ARMRAPass *local_68;
  ulong local_60;
  Operand_ local_58;
  Operand_ local_48;
  undefined8 local_38;
  
  uVar3 = *(uint *)&(this->super_BaseRAPass).super_FuncPass.super_Pass._cb[1].super_BaseEmitter.
                    _logger;
  local_68 = this;
  do {
    if (first == stop) {
      return 0;
    }
    pBVar5 = *(BaseNode **)(first + 8);
    bVar18 = true;
    if (((byte)first[0x11] & 0x20) != 0) {
      puVar6 = *(ulong **)(first + 0x20);
      BVar1 = first[0x12];
      if (puVar6 == (ulong *)0x0) {
LAB_00139b4f:
        o0 = (Operand_ *)(first + 0x40);
        if (BVar1 != (BaseNode)0x0) {
          pBVar7 = (this->super_BaseRAPass).super_FuncPass.super_Pass._cb;
          lVar15 = 0;
          do {
            uVar17 = *(uint *)((long)o0->_data + lVar15 + -8);
            bVar18 = true;
            if ((uVar17 & 0x2007) == 0x2002) {
              uVar16 = *(int *)(first + lVar15 + 0x44) - 0x100;
              bVar18 = uVar16 < uVar3;
              if (bVar18) {
                if (uVar16 < *(uint *)&pBVar7[1].super_BaseEmitter._logger) {
                  lVar8 = *(long *)((long)(&(pBVar7[1].super_BaseEmitter._code)->_environment)
                                          [uVar16] + 0x28);
                  if (lVar8 != 0) {
                    uVar16 = (this->super_BaseRAPass)._sp.super_Operand.super_Operand_._signature.
                             _bits;
                    pbVar9 = *(byte **)(lVar8 + 0x18);
                    iVar4 = *(int *)(pbVar9 + 0x10);
                    *(uint *)(first + lVar15 + 0x44) = (uint)*pbVar9;
                    *(uint *)((long)o0->_data + lVar15 + -8) = uVar17 & 0xffffdf02 | uVar16 & 0xf8;
                    *(int *)(first + lVar15 + 0x4c) = *(int *)(first + lVar15 + 0x4c) + iVar4;
                    goto LAB_00139bef;
                  }
                }
                else {
                  _rewrite();
                }
                _rewrite();
                goto LAB_00139f2d;
              }
              local_7c = 0x1e;
            }
LAB_00139bef:
            EVar12 = local_7c;
            if (!bVar18) goto LAB_00139c69;
            lVar15 = lVar15 + 0x10;
          } while ((ulong)(byte)BVar1 * 0x10 != lVar15);
        }
        bVar18 = true;
        if ((*(short *)(first + 0x30) == 6) && (first[0x12] == (BaseNode)0x2)) {
          if ((byte)first[0x13] < 2) {
LAB_00139f2d:
            _rewrite();
LAB_00139f32:
            _rewrite();
LAB_00139f37:
            _rewrite();
LAB_00139f3c:
            _rewrite();
LAB_00139f41:
            _rewrite();
LAB_00139f46:
            _rewrite();
LAB_00139f4b:
            _rewrite();
            __clang_call_terminate(extraout_RAX);
          }
          uVar17 = *(uint *)(first + 0x50);
          if ((uVar17 & 7) == 2) {
            uVar11 = *(uint32_t *)(first + 0x54);
            uVar13 = CONCAT44(uVar11,*(int *)(first + 0x5c));
            if ((uVar17 & 0xf8) != 0) {
              uVar13 = (long)*(int *)(first + 0x5c);
            }
            if ((uVar17 & 0x1ff8) == 0) {
              *(undefined4 *)(first + 0x30) = 0xf4;
              *(undefined8 *)(first + 0x50) = 4;
              *(int *)(first + 0x58) = (int)uVar13;
              *(int *)(first + 0x5c) = (int)(uVar13 >> 0x20);
            }
            else {
              if ((uVar17 & 0x1f00) == 0) {
                local_78._baseId = *(uint32_t *)(first + 0x44);
                local_78._signature._bits = 0x8000039;
                local_78._data[0] = 0;
                local_78._data[1] = 0;
                local_48._signature._bits = 0x8000039;
                local_48._data[0] = 0;
                local_48._data[1] = 0;
                instId = 3;
                if ((long)uVar13 < 0) {
                  instId = 0x174;
                }
                uVar14 = -uVar13;
                if (0 < (long)uVar13) {
                  uVar14 = uVar13;
                }
                *(InstId *)(first + 0x30) = instId;
                first[0x12] = (BaseNode)0x3;
                *(undefined4 *)(first + 0x50) = 0x8000039;
                *(undefined8 *)(first + 0x58) = 0;
                local_48._baseId = uVar11;
                if (first[0x13] == (BaseNode)0x2) goto LAB_00139f32;
                *(undefined8 *)(first + 0x60) = 4;
                uVar17 = (uint)uVar14;
                *(uint *)(first + 0x68) = uVar17;
                uVar11 = (uint32_t)(uVar14 >> 0x20);
                *(uint32_t *)(first + 0x6c) = uVar11;
                bVar18 = true;
                if ((uVar14 & 0xffffffffff000fff) == 0 || uVar14 < 0x1000) goto LAB_00139c7c;
                pBVar7 = (this->super_BaseRAPass).super_FuncPass.super_Pass._cb;
                pBVar7->_cursor = *(BaseNode **)first;
                if (uVar14 < 0x1000000) {
                  local_58._data[0] = uVar17 & 0xfff;
                  local_58._signature._bits = 4;
                  local_58._baseId = 0;
                  local_58._data[1] = 0;
                  local_60 = uVar14;
                  EVar12 = BaseEmitter::_emitI(&pBVar7->super_BaseEmitter,instId,&local_78,&local_48
                                               ,&local_58);
                  if (EVar12 == 0) {
                    if ((byte)first[0x13] < 2) goto LAB_00139f3c;
                    *(ulong *)(first + 0x50) = CONCAT44(local_78._baseId,local_78._signature._bits);
                    *(uint32_t (*) [2])(first + 0x58) = local_78._data;
                    if (first[0x13] != (BaseNode)0x2) {
                      *(undefined8 *)(first + 0x60) = 4;
                      *(uint *)(first + 0x68) = (uint)local_60 & 0xfff000;
                      uVar11 = 0;
LAB_00139e47:
                      *(uint32_t *)(first + 0x6c) = uVar11;
                      goto LAB_00139c7c;
                    }
                    goto LAB_00139f46;
                  }
                }
                else {
                  if (first[0x13] == (BaseNode)0x0) goto LAB_00139f37;
                  local_58._signature._bits = 4;
                  local_58._baseId = 0;
                  local_58._data[0] = uVar17;
                  local_58._data[1] = uVar11;
                  EVar12 = BaseEmitter::_emitI(&pBVar7->super_BaseEmitter,0xf4,o0,&local_58);
                  if (EVar12 == 0) {
                    if (1 < (byte)first[0x13]) {
                      *(ulong *)(first + 0x50) =
                           CONCAT44(local_48._baseId,local_48._signature._bits);
                      *(uint32_t (*) [2])(first + 0x58) = local_48._data;
                      if (first[0x13] == (BaseNode)0x2) goto LAB_00139f4b;
                      *(ulong *)(first + 0x60) =
                           CONCAT44(local_78._baseId,local_78._signature._bits);
                      *(uint32_t *)(first + 0x68) = local_78._data[0];
                      uVar11 = local_78._data[1];
                      goto LAB_00139e47;
                    }
                    goto LAB_00139f41;
                  }
                }
              }
              else {
                local_7c = 0x2c;
                EVar12 = local_7c;
              }
LAB_00139c69:
              local_7c = EVar12;
              bVar18 = false;
            }
          }
        }
      }
      else {
        uVar13 = puVar6[2];
        if ((ulong)(uint)uVar13 != 0) {
          uVar14 = 0;
          do {
            lVar15 = uVar14 * 0x20;
            uVar17 = *(uint *)((long)puVar6 + lVar15 + 100);
            if (uVar17 != 0) {
              bVar2 = *(byte *)((long)puVar6 + lVar15 + 0x5a);
              do {
                uVar16 = 0;
                if (uVar17 != 0) {
                  for (; (uVar17 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                  }
                }
                if (0x19 < uVar16) {
                  _rewrite();
                  goto LAB_00139f03;
                }
                *(uint *)(first + (ulong)uVar16 * 4 + 0x3c) = (uint)bVar2;
                uVar17 = uVar17 - 1 & uVar17;
              } while (uVar17 != 0);
            }
            uVar17 = (uint)puVar6[uVar14 * 4 + 0xd];
            if (uVar17 != 0) {
              bVar2 = *(byte *)((long)puVar6 + lVar15 + 0x5b);
              do {
                uVar16 = 0;
                if (uVar17 != 0) {
                  for (; (uVar17 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                  }
                }
                if (0x19 < uVar16) {
LAB_00139f03:
                  _rewrite();
                  return 0;
                }
                *(uint *)(first + (ulong)uVar16 * 4 + 0x3c) = (uint)bVar2;
                uVar17 = uVar17 - 1 & uVar17;
              } while (uVar17 != 0);
            }
            uVar14 = uVar14 + 1;
          } while (uVar14 != (uint)uVar13);
        }
        *(undefined8 *)(first + 0x20) = 0;
        bVar18 = true;
        if (first[0x10] == (BaseNode)0x11) {
          local_60 = *puVar6;
          bVar10 = BaseRAPass::isNextTo
                             (&local_68->super_BaseRAPass,first,
                              (BaseNode *)((local_68->super_BaseRAPass)._func)->_exitNode);
          if (!bVar10) {
            ((local_68->super_BaseRAPass).super_FuncPass.super_Pass._cb)->_cursor =
                 *(BaseNode **)first;
            local_78._baseId = *(uint32_t *)(((local_68->super_BaseRAPass)._func)->_exitNode + 0x30)
            ;
            local_78._signature._bits = 5;
            local_78._data[0] = 0;
            local_78._data[1] = 0;
            EVar12 = (*(local_68->super_BaseRAPass).super_FuncPass.super_Pass._vptr_Pass[0xd])();
            if (EVar12 != 0) {
              bVar18 = false;
              local_7c = EVar12;
              goto LAB_00139b3c;
            }
          }
          local_38 = *(undefined8 *)first;
          BaseBuilder::removeNode((local_68->super_BaseRAPass).super_FuncPass.super_Pass._cb,first);
          *(undefined8 *)(local_60 + 0x18) = local_38;
        }
LAB_00139b3c:
        this = local_68;
        if (bVar18) goto LAB_00139b4f;
        bVar18 = false;
      }
LAB_00139c7c:
      if (!bVar18) {
        pBVar5 = first;
      }
    }
    first = pBVar5;
    if (!bVar18) {
      return local_7c;
    }
  } while( true );
}

Assistant:

ASMJIT_FAVOR_SPEED Error ARMRAPass::_rewrite(BaseNode* first, BaseNode* stop) noexcept {
  uint32_t virtCount = cc()->_vRegArray.size();

  BaseNode* node = first;
  while (node != stop) {
    BaseNode* next = node->next();
    if (node->isInst()) {
      InstNode* inst = node->as<InstNode>();
      RAInst* raInst = node->passData<RAInst>();

      Operand* operands = inst->operands();
      uint32_t opCount = inst->opCount();

      uint32_t i;

      // Rewrite virtual registers into physical registers.
      if (raInst) {
        // If the instruction contains pass data (raInst) then it was a subject
        // for register allocation and must be rewritten to use physical regs.
        RATiedReg* tiedRegs = raInst->tiedRegs();
        uint32_t tiedCount = raInst->tiedCount();

        for (i = 0; i < tiedCount; i++) {
          RATiedReg* tiedReg = &tiedRegs[i];

          Support::BitWordIterator<uint32_t> useIt(tiedReg->useRewriteMask());
          uint32_t useId = tiedReg->useId();
          while (useIt.hasNext())
            inst->rewriteIdAtIndex(useIt.next(), useId);

          Support::BitWordIterator<uint32_t> outIt(tiedReg->outRewriteMask());
          uint32_t outId = tiedReg->outId();
          while (outIt.hasNext())
            inst->rewriteIdAtIndex(outIt.next(), outId);
        }

        // This data is allocated by Zone passed to `runOnFunction()`, which
        // will be reset after the RA pass finishes. So reset this data to
        // prevent having a dead pointer after the RA pass is complete.
        node->resetPassData();

        if (ASMJIT_UNLIKELY(node->type() != NodeType::kInst)) {
          // FuncRet terminates the flow, it must either be removed if the exit
          // label is next to it (optimization) or patched to an architecture
          // dependent jump instruction that jumps to the function's exit before
          // the epilog.
          if (node->type() == NodeType::kFuncRet) {
            RABlock* block = raInst->block();
            if (!isNextTo(node, _func->exitNode())) {
              cc()->_setCursor(node->prev());
              ASMJIT_PROPAGATE(emitJump(_func->exitNode()->label()));
            }

            BaseNode* prev = node->prev();
            cc()->removeNode(node);
            block->setLast(prev);
          }
        }
      }

      // Rewrite stack slot addresses.
      for (i = 0; i < opCount; i++) {
        Operand& op = operands[i];
        if (op.isMem()) {
          BaseMem& mem = op.as<BaseMem>();
          if (mem.isRegHome()) {
            uint32_t virtIndex = Operand::virtIdToIndex(mem.baseId());
            if (ASMJIT_UNLIKELY(virtIndex >= virtCount))
              return DebugUtils::errored(kErrorInvalidVirtId);

            VirtReg* virtReg = cc()->virtRegByIndex(virtIndex);
            RAWorkReg* workReg = virtReg->workReg();
            ASMJIT_ASSERT(workReg != nullptr);

            RAStackSlot* slot = workReg->stackSlot();
            int32_t offset = slot->offset();

            mem._setBase(_sp.type(), slot->baseRegId());
            mem.clearRegHome();
            mem.addOffsetLo32(offset);
          }
        }
      }

      // Rewrite `loadAddressOf()` construct.
      if (inst->realId() == Inst::kIdAdr && inst->opCount() == 2 && inst->op(1).isMem()) {
        BaseMem mem = inst->op(1).as<BaseMem>();
        int64_t offset = mem.offset();

        if (!mem.hasBaseOrIndex()) {
          inst->setId(Inst::kIdMov);
          inst->setOp(1, Imm(offset));
        }
        else {
          if (mem.hasIndex())
            return DebugUtils::errored(kErrorInvalidAddressIndex);

          GpX dst(inst->op(0).as<Gp>().id());
          GpX base(mem.baseId());

          InstId arithInstId = offset < 0 ? Inst::kIdSub : Inst::kIdAdd;
          uint64_t absOffset = offset < 0 ? Support::neg(uint64_t(offset)) : uint64_t(offset);

          inst->setId(arithInstId);
          inst->setOpCount(3);
          inst->setOp(1, base);
          inst->setOp(2, Imm(absOffset));

          // Use two operations if the offset cannot be encoded with ADD/SUB.
          if (absOffset > 0xFFFu && (absOffset & ~uint64_t(0xFFF000u)) != 0) {
            if (absOffset <= 0xFFFFFFu) {
              cc()->_setCursor(inst->prev());
              ASMJIT_PROPAGATE(cc()->emit(arithInstId, dst, base, Imm(absOffset & 0xFFFu)));

              inst->setOp(1, dst);
              inst->setOp(2, Imm(absOffset & 0xFFF000u));
            }
            else {
              cc()->_setCursor(inst->prev());
              ASMJIT_PROPAGATE(cc()->emit(Inst::kIdMov, inst->op(0), Imm(absOffset)));

              inst->setOp(1, base);
              inst->setOp(2, dst);
            }
          }
        }
      }
    }

    node = next;
  }

  return kErrorOk;
}